

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::CoverageMaskInvertCase::iterate(CoverageMaskInvertCase *this)

{
  ostringstream *poVar1;
  int iVar2;
  TestLog *log;
  bool bVar3;
  GLenum GVar4;
  Surface *pSVar5;
  void *__buf;
  void *__buf_00;
  char *description;
  allocator<char> local_212;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  Surface renderedImgSampleCoverage;
  Surface renderedImgNoSampleCoverage;
  undefined1 local_1a0 [384];
  
  log = ((this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
        m_log;
  iVar2 = (this->super_MultisampleCase).m_viewportSize;
  tcu::Surface::Surface(&renderedImgNoSampleCoverage,iVar2,iVar2);
  iVar2 = (this->super_MultisampleCase).m_viewportSize;
  tcu::Surface::Surface(&renderedImgSampleCoverage,iVar2,iVar2);
  MultisampleCase::randomizeViewport(&this->super_MultisampleCase);
  glwEnable(0xbe2);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glEnable(GL_BLEND)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x62b);
  glwBlendEquation(0x8006);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glBlendEquation(GL_FUNC_ADD)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x62c);
  glwBlendFunc(1,1);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glBlendFunc(GL_ONE, GL_ONE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x62d);
  poVar1 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Additive blending enabled in order to detect (erroneously) overlapping samples");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Clearing color to all-zeros");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  glwClearColor(0.0,0.0,0.0,0.0);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glClearColor(0.0f, 0.0f, 0.0f, 0.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x631);
  glwClear(0x4000);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glClear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x632);
  poVar1 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Drawing the pattern with GL_SAMPLE_COVERAGE disabled");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  drawPattern(this,false);
  MultisampleCase::readImage(&this->super_MultisampleCase,&renderedImgNoSampleCoverage);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"RenderedImageNoSampleCoverage",&local_211);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"Rendered image with GL_SAMPLE_COVERAGE disabled",&local_212);
  pSVar5 = &renderedImgNoSampleCoverage;
  tcu::LogImage::LogImage
            ((LogImage *)local_1a0,&local_1f0,&local_210,pSVar5,QP_IMAGE_COMPRESSION_MODE_PNG);
  tcu::LogImage::write((LogImage *)local_1a0,(int)log,__buf,(size_t)pSVar5);
  tcu::LogImage::~LogImage((LogImage *)local_1a0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  poVar1 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Clearing color to all-zeros");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  glwClear(0x4000);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glClear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x63a);
  glwEnable(0x80a0);
  GVar4 = glwGetError();
  glu::checkError(GVar4,"glEnable(GL_SAMPLE_COVERAGE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fMultisampleTests.cpp"
                  ,0x63b);
  poVar1 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Drawing the pattern with GL_SAMPLE_COVERAGE enabled, using non-inverted masks");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  drawPattern(this,false);
  poVar1 = (ostringstream *)(local_1a0 + 8);
  local_1a0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,
                  "Drawing the pattern with GL_SAMPLE_COVERAGE enabled, using same sample coverage values but inverted masks"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  drawPattern(this,true);
  MultisampleCase::readImage(&this->super_MultisampleCase,&renderedImgSampleCoverage);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"RenderedImageSampleCoverage",&local_211);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"Rendered image with GL_SAMPLE_COVERAGE enabled",&local_212);
  pSVar5 = &renderedImgSampleCoverage;
  tcu::LogImage::LogImage
            ((LogImage *)local_1a0,&local_1f0,&local_210,pSVar5,QP_IMAGE_COMPRESSION_MODE_PNG);
  tcu::LogImage::write((LogImage *)local_1a0,(int)log,__buf_00,(size_t)pSVar5);
  tcu::LogImage::~LogImage((LogImage *)local_1a0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  local_1a0._0_8_ = local_1a0._0_8_ & 0xffffffff00000000;
  bVar3 = tcu::pixelThresholdCompare
                    (log,"CoverageVsNoCoverage",
                     "Comparison of same pattern with GL_SAMPLE_COVERAGE disabled and enabled",
                     &renderedImgNoSampleCoverage,&renderedImgSampleCoverage,(RGBA *)local_1a0,
                     COMPARE_LOG_ON_ERROR);
  if (bVar3) {
    poVar1 = (ostringstream *)(local_1a0 + 8);
    local_1a0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Success: The two images rendered are identical");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    description = "Passed";
  }
  else {
    description = "Failed";
  }
  tcu::TestContext::setTestResult
            (((this->super_MultisampleCase).super_TestCase.m_context)->m_testCtx,(uint)!bVar3,
             description);
  tcu::Surface::~Surface(&renderedImgSampleCoverage);
  tcu::Surface::~Surface(&renderedImgNoSampleCoverage);
  return STOP;
}

Assistant:

CoverageMaskInvertCase::IterateResult CoverageMaskInvertCase::iterate (void)
{
	TestLog&		log								= m_testCtx.getLog();
	tcu::Surface	renderedImgNoSampleCoverage		(m_viewportSize, m_viewportSize);
	tcu::Surface	renderedImgSampleCoverage		(m_viewportSize, m_viewportSize);

	randomizeViewport();

	GLU_CHECK_CALL(glEnable(GL_BLEND));
	GLU_CHECK_CALL(glBlendEquation(GL_FUNC_ADD));
	GLU_CHECK_CALL(glBlendFunc(GL_ONE, GL_ONE));
	log << TestLog::Message << "Additive blending enabled in order to detect (erroneously) overlapping samples" << TestLog::EndMessage;

	log << TestLog::Message << "Clearing color to all-zeros" << TestLog::EndMessage;
	GLU_CHECK_CALL(glClearColor(0.0f, 0.0f, 0.0f, 0.0f));
	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));
	log << TestLog::Message << "Drawing the pattern with GL_SAMPLE_COVERAGE disabled" << TestLog::EndMessage;
	drawPattern(false);
	readImage(renderedImgNoSampleCoverage);

	log << TestLog::Image("RenderedImageNoSampleCoverage", "Rendered image with GL_SAMPLE_COVERAGE disabled", renderedImgNoSampleCoverage, QP_IMAGE_COMPRESSION_MODE_PNG);

	log << TestLog::Message << "Clearing color to all-zeros" << TestLog::EndMessage;
	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT));
	GLU_CHECK_CALL(glEnable(GL_SAMPLE_COVERAGE));
	log << TestLog::Message << "Drawing the pattern with GL_SAMPLE_COVERAGE enabled, using non-inverted masks" << TestLog::EndMessage;
	drawPattern(false);
	log << TestLog::Message << "Drawing the pattern with GL_SAMPLE_COVERAGE enabled, using same sample coverage values but inverted masks" << TestLog::EndMessage;
	drawPattern(true);
	readImage(renderedImgSampleCoverage);

	log << TestLog::Image("RenderedImageSampleCoverage", "Rendered image with GL_SAMPLE_COVERAGE enabled", renderedImgSampleCoverage, QP_IMAGE_COMPRESSION_MODE_PNG);

	bool passed = tcu::pixelThresholdCompare(log,
											 "CoverageVsNoCoverage",
											 "Comparison of same pattern with GL_SAMPLE_COVERAGE disabled and enabled",
											 renderedImgNoSampleCoverage,
											 renderedImgSampleCoverage,
											 tcu::RGBA(0),
											 tcu::COMPARE_LOG_ON_ERROR);

	if (passed)
		log << TestLog::Message << "Success: The two images rendered are identical" << TestLog::EndMessage;

	m_context.getTestContext().setTestResult(passed ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
											 passed ? "Passed"				: "Failed");

	return STOP;
}